

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int rd_pick_intra_angle_sbuv
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int rate_overhead,int64_t best_rd,
              int *rate,RD_STATS *rd_stats)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  int64_t *piVar5;
  int64_t iVar6;
  ulong uVar7;
  bool bVar8;
  int best_angle_delta;
  int local_bc;
  int64_t best_rd_local;
  undefined8 local_b0;
  MB_MODE_INFO *local_a8;
  AV1_COMP *local_a0;
  MACROBLOCK *local_98;
  int *local_90;
  int64_t rd_cost [10];
  
  local_a8 = *(x->e_mbd).mi;
  best_angle_delta = 0;
  rd_stats->rate = 0x7fffffff;
  rd_stats->skip_txfm = '\0';
  rd_stats->dist = 0x7fffffffffffffff;
  lVar1 = 0;
  do {
    rd_cost[lVar1] = 0x7fffffffffffffff;
    rd_cost[lVar1 + 1] = 0x7fffffffffffffff;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 10);
  piVar5 = rd_cost;
  local_b0 = 0;
  uVar7 = 0;
  local_bc = rate_overhead;
  best_rd_local = best_rd;
  local_a0 = cpi;
  local_98 = x;
  local_90 = rate;
  do {
    uVar3 = uVar7 & 0xffffffff;
    lVar1 = 0;
    do {
      iVar6 = (best_rd_local >> (uVar7 != 0) * '\x02' + 3) + best_rd_local;
      if (best_rd_local == 0x7fffffffffffffff) {
        iVar6 = 0x7fffffffffffffff;
      }
      local_a8->angle_delta[1] = (char)uVar3;
      iVar6 = pick_intra_angle_routine_sbuv
                        (local_a0,local_98,bsize,local_bc,iVar6,local_90,rd_stats,&best_angle_delta,
                         &best_rd_local);
      piVar5[lVar1] = iVar6;
      if (uVar7 == 0) {
        if (iVar6 == 0x7fffffffffffffff) {
          return 0;
        }
        rd_cost[1] = iVar6;
        break;
      }
      lVar1 = lVar1 + 1;
      uVar3 = (ulong)(byte)((char)uVar3 + (char)local_b0);
    } while (lVar1 == 1);
    local_b0 = CONCAT71((int7)((ulong)local_b0 >> 8),(char)local_b0 + -4);
    piVar5 = piVar5 + 4;
    bVar8 = uVar7 != 0;
    uVar7 = uVar7 + 2;
    if (bVar8) {
      cVar4 = -2;
      piVar5 = rd_cost;
      uVar7 = 1;
      do {
        piVar5 = piVar5 + 4;
        uVar3 = uVar7 & 0xffffffff;
        lVar1 = 0;
        do {
          lVar2 = (best_rd_local >> 5) + best_rd_local;
          if ((piVar5[lVar1] <= lVar2) || (piVar5[lVar1 + -4] <= lVar2)) {
            local_a8->angle_delta[1] = (char)uVar3;
            pick_intra_angle_routine_sbuv
                      (local_a0,local_98,bsize,local_bc,best_rd_local,local_90,rd_stats,
                       &best_angle_delta,&best_rd_local);
          }
          lVar1 = lVar1 + 1;
          uVar3 = (ulong)(byte)((char)uVar3 + cVar4);
        } while (lVar1 == 1);
        cVar4 = cVar4 + -4;
        bVar8 = uVar7 < 2;
        uVar7 = uVar7 + 2;
      } while (bVar8);
      local_a8->angle_delta[1] = (int8_t)best_angle_delta;
      return (uint)(rd_stats->rate != 0x7fffffff);
    }
  } while( true );
}

Assistant:

static int rd_pick_intra_angle_sbuv(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    BLOCK_SIZE bsize, int rate_overhead,
                                    int64_t best_rd, int *rate,
                                    RD_STATS *rd_stats) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int i, angle_delta, best_angle_delta = 0;
  int64_t this_rd, best_rd_in, rd_cost[2 * (MAX_ANGLE_DELTA + 2)];

  rd_stats->rate = INT_MAX;
  rd_stats->skip_txfm = 0;
  rd_stats->dist = INT64_MAX;
  for (i = 0; i < 2 * (MAX_ANGLE_DELTA + 2); ++i) rd_cost[i] = INT64_MAX;

  for (angle_delta = 0; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    for (i = 0; i < 2; ++i) {
      best_rd_in = (best_rd == INT64_MAX)
                       ? INT64_MAX
                       : (best_rd + (best_rd >> ((angle_delta == 0) ? 3 : 5)));
      mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
      this_rd = pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead,
                                              best_rd_in, rate, rd_stats,
                                              &best_angle_delta, &best_rd);
      rd_cost[2 * angle_delta + i] = this_rd;
      if (angle_delta == 0) {
        if (this_rd == INT64_MAX) return 0;
        rd_cost[1] = this_rd;
        break;
      }
    }
  }

  assert(best_rd != INT64_MAX);
  for (angle_delta = 1; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    int64_t rd_thresh;
    for (i = 0; i < 2; ++i) {
      int skip_search = 0;
      rd_thresh = best_rd + (best_rd >> 5);
      if (rd_cost[2 * (angle_delta + 1) + i] > rd_thresh &&
          rd_cost[2 * (angle_delta - 1) + i] > rd_thresh)
        skip_search = 1;
      if (!skip_search) {
        mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
        pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                      rate, rd_stats, &best_angle_delta,
                                      &best_rd);
      }
    }
  }

  mbmi->angle_delta[PLANE_TYPE_UV] = best_angle_delta;
  return rd_stats->rate != INT_MAX;
}